

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_page.cpp
# Opt level: O2

void __thiscall http::Page::SendASCIIString(Page *this,char *string)

{
  size_t length;
  char *p;
  char buffer [4];
  
  for (; *string != '\0'; string = string + 1) {
    length = 1;
    p = string;
    if ((byte)(*string + 0x81U) < 0xa2) {
      snprintf(buffer,4,"%%%02X");
      length = 3;
      p = buffer;
    }
    RawSend(this,p,length);
  }
  return;
}

Assistant:

void http::Page::SendASCIIString(const char* string)
{
    char buffer[4];

    while (*string)
    {
        if (*string < 0x21 || *string > 0x7E)
        {
            snprintf(buffer, sizeof(buffer), "%%%02X", *string);
            RawSend(buffer, 3);
        }
        else
        {
            RawSend(string, 1);
        }
        string++;
    }
}